

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementCableANCF::ChElementCableANCF(ChElementCableANCF *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  auVar2 = ZEXT1632(auVar1);
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K =
       (ChMatrixDynamic<double>)auVar2._0_24_;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar2;
  (this->super_ChElementBeam).mass = 0.0;
  (this->super_ChElementBeam).length = 0.0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x117f090;
  this->super_ChLoadableU = (ChLoadableU)0x117f278;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x117f360;
  (this->section).super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                 )SUB3224(ZEXT1632(auVar1),0);
  (this->section).super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SUB328(ZEXT1632(auVar1),0x18);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::resize(&this->nodes,2);
  this->m_use_damping = false;
  this->m_alpha = 0.0;
  return;
}

Assistant:

ChElementCableANCF::ChElementCableANCF() {
    nodes.resize(2);
    m_use_damping = false;  // flag to add internal damping and its Jacobian
    m_alpha = 0.0;          // scaling factor for internal damping

    // this->StiffnessMatrix.Resize(this->GetNdofs(), this->GetNdofs());
    // this->MassMatrix.Resize(this->GetNdofs(), this->GetNdofs());
}